

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traversal_algorithm.cpp
# Opt level: O0

bool __thiscall libtorrent::dht::traversal_algorithm::add_requests(traversal_algorithm *this)

{
  char cVar1;
  char cVar2;
  dht_observer *pdVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  session_settings *this_00;
  __shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2> *this_01;
  node *this_02;
  ulong uVar10;
  node_id *pnVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined4 extraout_var;
  reference psVar14;
  ulong uVar15;
  address *addr;
  span<const_char> in;
  bool local_181;
  shared_ptr<libtorrent::dht::observer> local_108;
  undefined1 local_f5;
  address local_e8;
  string local_c8;
  aux *local_a8;
  char *local_a0;
  string local_98;
  __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
  local_78;
  dht_observer *local_70;
  dht_observer *logger;
  uchar local_60;
  bitfield_flag local_5f;
  undefined1 local_5e;
  uchar local_5d;
  bitfield_flag local_5c;
  undefined1 local_5b;
  uchar local_5a;
  bitfield_flag local_59;
  element_type *local_58;
  observer *o;
  iterator end;
  iterator i;
  uint local_38;
  int iStack_34;
  bool agg;
  int outstanding;
  int results_target;
  traversal_algorithm *this_local;
  
  if ((this->m_done & 1U) == 0) {
    iStack_34 = routing_table::bucket_size(&this->m_node->m_table);
    local_38 = 0;
    this_00 = dht::node::settings(this->m_node);
    bVar4 = libtorrent::aux::session_settings::get_bool(this_00,0x8049);
    end = ::std::
          vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
          ::begin(&this->m_results);
    o = (observer *)
        ::std::
        vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
        ::end(&this->m_results);
    while( true ) {
      bVar5 = __gnu_cxx::operator!=
                        (&end,(__normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
                               *)&o);
      bVar6 = false;
      if ((bVar5) && (bVar6 = false, 0 < iStack_34)) {
        if (bVar4) {
          bVar6 = (int)local_38 < (int)this->m_branch_factor;
        }
        else {
          bVar6 = this->m_invoke_count < this->m_branch_factor;
        }
      }
      if (!bVar6) break;
      this_01 = &__gnu_cxx::
                 __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
                 ::operator->(&end)->
                 super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>;
      local_58 = ::std::__shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>::get
                           (this_01);
      local_5a = (local_58->flags).m_val;
      local_5b = 0x40;
      local_59 = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
                            )local_5a,
                            (bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
                            )0x40);
      bVar6 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_59);
      if (bVar6) {
        iStack_34 = iStack_34 + -1;
      }
      else {
        local_5d = (local_58->flags).m_val;
        local_5e = 1;
        local_5c = (bitfield_flag)
                   libtorrent::flags::operator&
                             ((bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
                               )local_5d,
                              (bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
                               )0x1);
        bVar6 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_5c);
        if (bVar6) {
          local_60 = (local_58->flags).m_val;
          logger._7_1_ = 0x10;
          local_5f = (bitfield_flag)
                     libtorrent::flags::operator&
                               ((bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
                                 )local_60,
                                (bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
                                 )0x10);
          bVar6 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_5f);
          if (((bVar6 ^ 0xffU) & 1) != 0) {
            local_38 = local_38 + 1;
          }
        }
        else {
          this_02 = get_node(this);
          local_70 = dht::node::observer(this_02);
          if ((local_70 != (dht_observer *)0x0) &&
             (uVar7 = (**(local_70->super_dht_logger)._vptr_dht_logger)(local_70,4),
             pdVar3 = local_70, (uVar7 & 1) != 0)) {
            uVar7 = this->m_id;
            local_78._M_current =
                 (shared_ptr<libtorrent::dht::observer> *)
                 ::std::
                 vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                 ::end(&this->m_results);
            uVar10 = __gnu_cxx::operator-(&local_78,&end);
            cVar1 = this->m_invoke_count;
            cVar2 = this->m_branch_factor;
            uVar15 = (ulong)(uint)(int)cVar2;
            pnVar11 = observer::id(local_58);
            iVar8 = distance_exp(&this->m_target,pnVar11);
            pnVar11 = observer::id(local_58);
            span<char_const>::span<libtorrent::digest32<160l>,char,void>
                      ((span<char_const> *)&local_a8,pnVar11);
            in.m_len = uVar15;
            in.m_ptr = local_a0;
            libtorrent::aux::to_hex_abi_cxx11_(&local_98,local_a8,in);
            uVar12 = ::std::__cxx11::string::c_str();
            observer::target_addr(&local_e8,local_58);
            libtorrent::aux::print_address_abi_cxx11_(&local_c8,(aux *)&local_e8,addr);
            uVar13 = ::std::__cxx11::string::c_str();
            iVar9 = (*this->_vptr_traversal_algorithm[2])();
            (*(pdVar3->super_dht_logger)._vptr_dht_logger[1])
                      (pdVar3,4,
                       "[%u] INVOKE nodes-left: %d top-invoke-count: %d invoke-count: %d branch-factor: %d distance: %d id: %s addr: %s type: %s"
                       ,(ulong)uVar7,uVar10 & 0xffffffff,(ulong)local_38,(int)cVar1,(int)cVar2,iVar8
                       ,uVar12,uVar13,CONCAT44(extraout_var,iVar9));
            ::std::__cxx11::string::~string((string *)&local_c8);
            ::std::__cxx11::string::~string((string *)&local_98);
          }
          if ((this->m_abort & 1U) == 0) {
            local_f5 = 1;
            libtorrent::flags::
            bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>::operator|=
                      (&local_58->flags,
                       (bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>)0x1)
            ;
            psVar14 = __gnu_cxx::
                      __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
                      ::operator*(&end);
            ::std::shared_ptr<libtorrent::dht::observer>::shared_ptr(&local_108,psVar14);
            uVar7 = (*this->_vptr_traversal_algorithm[6])(this,&local_108);
            ::std::shared_ptr<libtorrent::dht::observer>::~shared_ptr(&local_108);
            if ((uVar7 & 1) == 0) {
              libtorrent::flags::
              bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>::operator|=
                        (&local_58->flags,
                         (bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>)
                         0x10);
            }
            else {
              this->m_invoke_count = this->m_invoke_count + '\x01';
              local_38 = local_38 + 1;
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
      ::operator++(&end);
    }
    if ((iStack_34 != 0) || (local_181 = true, local_38 != 0)) {
      local_181 = this->m_invoke_count == '\0';
    }
    this_local._7_1_ = local_181;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool traversal_algorithm::add_requests()
{
	INVARIANT_CHECK;
	if (m_done) return true;

	int results_target = m_node.m_table.bucket_size();

	// this only counts outstanding requests at the top of the
	// target list. This is <= m_invoke count. m_invoke_count
	// is the total number of outstanding requests, including
	// old ones that may be waiting on nodes much farther behind
	// the current point we've reached in the search.
	int outstanding = 0;

	// if we're doing aggressive lookups, we keep branch-factor
	// outstanding requests _at the tops_ of the result list. Otherwise
	// we just keep any branch-factor outstanding requests
	bool const agg = m_node.settings().get_bool(settings_pack::dht_aggressive_lookups);

	// Find the first node that hasn't already been queried.
	// and make sure that the 'm_branch_factor' top nodes
	// stay queried at all times (obviously ignoring failed nodes)
	// and without surpassing the 'result_target' nodes (i.e. k=8)
	// this is a slight variation of the original paper which instead
	// limits the number of outstanding requests, this limits the
	// number of good outstanding requests. It will use more traffic,
	// but is intended to speed up lookups
	for (auto i = m_results.begin()
		, end(m_results.end()); i != end
		&& results_target > 0
		&& (agg ? outstanding < m_branch_factor
			: m_invoke_count < m_branch_factor);
		++i)
	{
		observer* o = i->get();
		if (o->flags & observer::flag_alive)
		{
			TORRENT_ASSERT(o->flags & observer::flag_queried);
			--results_target;
			continue;
		}
		if (o->flags & observer::flag_queried)
		{
			// if it's queried, not alive and not failed, it
			// must be currently in flight
			if (!(o->flags & observer::flag_failed))
				++outstanding;

			continue;
		}

#ifndef TORRENT_DISABLE_LOGGING
		dht_observer* logger = get_node().observer();
		if (logger != nullptr && logger->should_log(dht_logger::traversal))
		{
			logger->log(dht_logger::traversal
				, "[%u] INVOKE nodes-left: %d top-invoke-count: %d "
				"invoke-count: %d branch-factor: %d "
				"distance: %d id: %s addr: %s type: %s"
				, m_id, int(m_results.end() - i), outstanding, int(m_invoke_count)
				, int(m_branch_factor), distance_exp(m_target, o->id()), aux::to_hex(o->id()).c_str()
				, aux::print_address(o->target_addr()).c_str(), name());
		}
#endif

		// we're shutting down, don't issue any more lookups
		if (m_abort) continue;

		TORRENT_ASSERT(!(o->flags & observer::flag_queried));
		o->flags |= observer::flag_queried;
		if (invoke(*i))
		{
			TORRENT_ASSERT(m_invoke_count < std::numeric_limits<std::int8_t>::max());
			++m_invoke_count;
			++outstanding;
		}
		else
		{
			o->flags |= observer::flag_failed;
		}
	}

	// this is the completion condition. If we found m_node.m_table.bucket_size()
	// (i.e. k=8) completed results, without finding any still
	// outstanding requests, we're done.
	// also, if invoke count is 0, it means we didn't even find 'k'
	// working nodes, we still have to terminate though.
	return (results_target == 0 && outstanding == 0) || m_invoke_count == 0;
}